

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iinq.c
# Opt level: O0

ion_status_t iinq_update(char *schema_file_name,ion_key_t key,ion_value_t value)

{
  ion_err_t iVar1;
  uint local_a0;
  undefined1 local_98 [8];
  ion_dictionary_handler_t handler;
  ion_dictionary_t dictionary;
  ion_err_t error;
  ion_value_t value_local;
  ion_key_t key_local;
  char *schema_file_name_local;
  ion_status_t status;
  
  iVar1 = iinq_open_source(schema_file_name,(ion_dictionary_t *)&handler.close_dictionary,
                           (ion_dictionary_handler_t *)local_98);
  if (iVar1 == '\0') {
    schema_file_name_local =
         (char *)dictionary_update((ion_dictionary_t *)&handler.close_dictionary,key,value);
    iVar1 = ion_close_dictionary((ion_dictionary_t *)&handler.close_dictionary);
    if (((char)schema_file_name_local == '\0') && (iVar1 != '\0')) {
      schema_file_name_local = (char *)CONCAT71(SUB87(schema_file_name_local,1),iVar1);
    }
  }
  else {
    local_a0 = CONCAT31(local_a0._1_3_,iVar1);
    schema_file_name_local = (char *)(ulong)local_a0;
  }
  return (ion_status_t)schema_file_name_local;
}

Assistant:

ion_status_t
iinq_update(
	char		*schema_file_name,
	ion_key_t	key,
	ion_value_t value
) {
	ion_err_t					error;
	ion_status_t				status = ION_STATUS_INITIALIZE;
	ion_dictionary_t			dictionary;
	ion_dictionary_handler_t	handler;

	dictionary.handler	= &handler;

	error				= iinq_open_source(schema_file_name, &dictionary, &handler);

	if (err_ok != error) {
		status = ION_STATUS_ERROR(error);
		goto RETURN;
	}

	status	= dictionary_update(&dictionary, key, value);
	error	= ion_close_dictionary(&dictionary);

	if ((err_ok == status.error) && (err_ok != error)) {
		status.error = error;
	}

RETURN: return status;
}